

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall Heap<SAT::VarOrderLt>::percolateDown(Heap<SAT::VarOrderLt> *this,int i)

{
  uint index;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  int *piVar5;
  uint in_ESI;
  long in_RDI;
  int child;
  int x;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  vec<int> *in_stack_ffffffffffffffb0;
  undefined4 local_44;
  undefined4 local_c;
  
  puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),in_ESI);
  index = *puVar4;
  local_c = in_ESI;
  while( true ) {
    iVar2 = left(local_c);
    uVar3 = vec<int>::size((vec<int> *)(in_RDI + 8));
    if ((int)uVar3 <= iVar2) break;
    iVar2 = right(local_c);
    uVar3 = vec<int>::size((vec<int> *)(in_RDI + 8));
    if (iVar2 < (int)uVar3) {
      uVar3 = right(local_c);
      vec<int>::operator[]((vec<int> *)(in_RDI + 8),uVar3);
      uVar3 = left(local_c);
      vec<int>::operator[]((vec<int> *)(in_RDI + 8),uVar3);
      bVar1 = SAT::VarOrderLt::operator()
                        ((VarOrderLt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                         in_stack_ffffffffffffffa8);
      if (!bVar1) goto LAB_00297abc;
      local_44 = right(local_c);
    }
    else {
LAB_00297abc:
      local_44 = left(local_c);
    }
    vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_44);
    bVar1 = SAT::VarOrderLt::operator()
                      ((VarOrderLt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                       in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    piVar5 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_44);
    in_stack_ffffffffffffffac = *piVar5;
    piVar5 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    *piVar5 = in_stack_ffffffffffffffac;
    in_stack_ffffffffffffffb0 = (vec<int> *)(in_RDI + 0x18);
    puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    puVar4 = (uint *)vec<int>::operator[](in_stack_ffffffffffffffb0,*puVar4);
    *puVar4 = local_c;
    local_c = local_44;
  }
  puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
  *puVar4 = index;
  puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),index);
  *puVar4 = local_c;
  return;
}

Assistant:

inline void percolateDown(int i) {
		const int x = heap[i];
		while (left(i) < static_cast<int>(heap.size())) {
			const int child =
					right(i) < static_cast<int>(heap.size()) && lt(heap[right(i)], heap[left(i)]) ? right(i)
																																												: left(i);
			if (!lt(heap[child], x)) {
				break;
			}
			heap[i] = heap[child];
			indices[heap[i]] = i;
			i = child;
		}
		heap[i] = x;
		indices[x] = i;
	}